

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_15::BinaryReaderIR::OnEndExpr(BinaryReaderIR *this)

{
  Offset OVar1;
  pointer pLVar2;
  Result RVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  Expr *expr;
  LabelNode *label;
  Expr *local_38;
  LabelNode *local_30;
  
  if ((ulong)(((long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2)
  goto LAB_00119738;
  RVar3 = TopLabelExpr(this,&local_30,&local_38);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  switch(local_30->label_type) {
  case Block:
    if (local_38->type_ != Block) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
      ;
      goto LAB_0011979d;
    }
    break;
  case Loop:
    if (local_38->type_ != Loop) {
      pcVar6 = 
      "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
      ;
      goto LAB_0011979d;
    }
    break;
  case If:
    if (local_38->type_ != If) {
LAB_00119771:
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0011979d:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                    ,0x4e,pcVar6);
    }
    break;
  case Else:
    if (local_38->type_ != If) goto LAB_00119771;
    pcVar6 = this->filename_;
    OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    pcVar4 = (char *)strlen(pcVar6);
    local_38[6].loc.filename._M_str = pcVar4;
    local_38[6].loc.field_1.field_1.offset = (size_t)pcVar6;
    *(Offset *)((long)&local_38[6].loc.field_1 + 8) = OVar1;
    local_38 = (Expr *)&local_38[6].type_;
    goto LAB_00119727;
  case Try:
    if (local_38->type_ != Try) {
      pcVar6 = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
      goto LAB_0011979d;
    }
    break;
  default:
    goto switchD_00119647_default;
  }
  pcVar6 = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar5 = strlen(pcVar6);
  local_38[5].loc.field_1.field_1.offset = sVar5;
  *(char **)((long)&local_38[5].loc.field_1 + 8) = pcVar6;
  *(Offset *)&local_38[5].type_ = OVar1;
  local_38 = local_38 + 6;
LAB_00119727:
  local_38->_vptr_Expr = (_func_int **)0x0;
switchD_00119647_default:
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
LAB_00119738:
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar2 == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    PrintError(this,"popping empty label stack");
    return (Result)Error;
  }
  (this->label_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + -1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnEndExpr() {
  if (label_stack_.size() > 1) {
    LabelNode* label;
    Expr* expr;
    CHECK_RESULT(TopLabelExpr(&label, &expr));
    switch (label->label_type) {
      case LabelType::Block:
        cast<BlockExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::Loop:
        cast<LoopExpr>(expr)->block.end_loc = GetLocation();
        break;
      case LabelType::If:
        cast<IfExpr>(expr)->true_.end_loc = GetLocation();
        break;
      case LabelType::Else:
        cast<IfExpr>(expr)->false_end_loc = GetLocation();
        break;
      case LabelType::Try:
        cast<TryExpr>(expr)->block.end_loc = GetLocation();
        break;

      case LabelType::InitExpr:
      case LabelType::Func:
      case LabelType::Catch:
        break;
    }
  }

  return PopLabel();
}